

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall pybind11::detail::generic_type::initialize(generic_type *this,type_record *rec)

{
  list *this_00;
  handle obj;
  _func_void_instance_ptr_void_ptr *p_Var1;
  bool bVar2;
  byte bVar3;
  type_info *ptVar4;
  PyObject *pPVar5;
  pointer pcVar6;
  internals *this_01;
  mapped_type *pmVar7;
  mapped_type *ppvVar8;
  vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>> *pvVar9;
  size_t sVar10;
  PyTypeObject *type;
  type_index tindex;
  allocator local_89;
  undefined1 local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  obj.m_ptr = (rec->scope).m_ptr;
  if ((obj.m_ptr != (PyObject *)0x0) && (bVar2 = hasattr(obj,rec->name), bVar2)) {
    std::__cxx11::string::string((string *)&local_68,rec->name,&local_89);
    std::operator+(&local_48,"generic_type: cannot initialize type \"",&local_68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   &local_48,"\": an object with that name is already defined");
    pybind11_fail((string *)local_88);
  }
  ptVar4 = get_type_info(rec->type,false);
  if (ptVar4 != (type_info *)0x0) {
    std::__cxx11::string::string((string *)&local_68,rec->name,&local_89);
    std::operator+(&local_48,"generic_type: type \"",&local_68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   &local_48,"\" is already registered!");
    pybind11_fail((string *)local_88);
  }
  pPVar5 = make_new_python_type(rec);
  (this->super_object).super_handle.m_ptr = pPVar5;
  pcVar6 = (pointer)operator_new(0x88);
  pcVar6[0x30] = '\0';
  pcVar6[0x31] = '\0';
  pcVar6[0x32] = '\0';
  pcVar6[0x33] = '\0';
  pcVar6[0x34] = '\0';
  pcVar6[0x35] = '\0';
  pcVar6[0x36] = '\0';
  pcVar6[0x37] = '\0';
  pcVar6[0x38] = '\0';
  pcVar6[0x39] = '\0';
  pcVar6[0x3a] = '\0';
  pcVar6[0x3b] = '\0';
  pcVar6[0x3c] = '\0';
  pcVar6[0x3d] = '\0';
  pcVar6[0x3e] = '\0';
  pcVar6[0x3f] = '\0';
  pcVar6[0x40] = '\0';
  pcVar6[0x41] = '\0';
  pcVar6[0x42] = '\0';
  pcVar6[0x43] = '\0';
  pcVar6[0x44] = '\0';
  pcVar6[0x45] = '\0';
  pcVar6[0x46] = '\0';
  pcVar6[0x47] = '\0';
  pcVar6[0x48] = '\0';
  pcVar6[0x49] = '\0';
  pcVar6[0x4a] = '\0';
  pcVar6[0x4b] = '\0';
  pcVar6[0x4c] = '\0';
  pcVar6[0x4d] = '\0';
  pcVar6[0x4e] = '\0';
  pcVar6[0x4f] = '\0';
  pcVar6[0x50] = '\0';
  pcVar6[0x51] = '\0';
  pcVar6[0x52] = '\0';
  pcVar6[0x53] = '\0';
  pcVar6[0x54] = '\0';
  pcVar6[0x55] = '\0';
  pcVar6[0x56] = '\0';
  pcVar6[0x57] = '\0';
  pcVar6[0x58] = '\0';
  pcVar6[0x59] = '\0';
  pcVar6[0x5a] = '\0';
  pcVar6[0x5b] = '\0';
  pcVar6[0x5c] = '\0';
  pcVar6[0x5d] = '\0';
  pcVar6[0x5e] = '\0';
  pcVar6[0x5f] = '\0';
  pcVar6[0x60] = '\0';
  pcVar6[0x61] = '\0';
  pcVar6[0x62] = '\0';
  pcVar6[99] = '\0';
  pcVar6[100] = '\0';
  pcVar6[0x65] = '\0';
  pcVar6[0x66] = '\0';
  pcVar6[0x67] = '\0';
  pcVar6[0x68] = '\0';
  pcVar6[0x69] = '\0';
  pcVar6[0x6a] = '\0';
  pcVar6[0x6b] = '\0';
  pcVar6[0x6c] = '\0';
  pcVar6[0x6d] = '\0';
  pcVar6[0x6e] = '\0';
  pcVar6[0x6f] = '\0';
  pcVar6[0x80] = '\0';
  pcVar6[0x81] = '\0';
  pcVar6[0x82] = '\0';
  pcVar6[0x83] = '\0';
  pcVar6[0x84] = '\0';
  pcVar6[0x85] = '\0';
  pcVar6[0x86] = '\0';
  pcVar6[0x87] = '\0';
  pcVar6[0x70] = '\0';
  pcVar6[0x71] = '\0';
  pcVar6[0x72] = '\0';
  pcVar6[0x73] = '\0';
  pcVar6[0x74] = '\0';
  pcVar6[0x75] = '\0';
  pcVar6[0x76] = '\0';
  pcVar6[0x77] = '\0';
  pcVar6[0x78] = '\0';
  pcVar6[0x79] = '\0';
  pcVar6[0x7a] = '\0';
  pcVar6[0x7b] = '\0';
  pcVar6[0x7c] = '\0';
  pcVar6[0x7d] = '\0';
  pcVar6[0x7e] = '\0';
  pcVar6[0x7f] = '\0';
  *(PyObject **)pcVar6 = pPVar5;
  *(type_info **)(pcVar6 + 8) = rec->type;
  *(size_t *)(pcVar6 + 0x10) = rec->type_size;
  *(size_t *)(pcVar6 + 0x18) = (rec->holder_size - 1 >> 3) + 1;
  p_Var1 = rec->init_holder;
  *(_func_void_ptr_size_t **)(pcVar6 + 0x20) = rec->operator_new;
  *(_func_void_instance_ptr_void_ptr **)(pcVar6 + 0x28) = p_Var1;
  *(_func_void_value_and_holder_ptr **)(pcVar6 + 0x30) = rec->dealloc;
  pcVar6[0x80] = '\x03';
  this_01 = get_internals();
  local_48._M_dataplus._M_p = (pointer)rec->type;
  pmVar7 = std::__detail::
           _Map_base<std::type_index,_std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this_01->direct_conversions,(key_type *)&local_48);
  *(mapped_type **)(pcVar6 + 0x68) = pmVar7;
  pcVar6[0x80] = (byte)rec->field_0x58 >> 1 & 4 | 3;
  ppvVar8 = std::__detail::
            _Map_base<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_01,(key_type *)&local_48);
  *ppvVar8 = pcVar6;
  local_68._M_dataplus._M_p = (pointer)(this->super_object).super_handle.m_ptr;
  local_88._0_8_ = pcVar6;
  pvVar9 = (vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>> *)
           std::__detail::
           _Map_base<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this_01->registered_types_py,(key_type *)&local_68);
  std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>::
  _M_assign_aux<pybind11::detail::type_info*const*>(pvVar9,local_88,local_88 + 8);
  this_00 = &rec->bases;
  sVar10 = list::size(this_00);
  if ((sVar10 < 2) && ((rec->field_0x58 & 1) == 0)) {
    sVar10 = list::size(this_00);
    if (sVar10 != 1) {
      return;
    }
    local_88._8_8_ = (this_00->super_object).super_handle.m_ptr;
    local_88._16_8_ = 0;
    local_88._24_8_ = (PyObject *)0x0;
    type = (PyTypeObject *)
           accessor<pybind11::detail::accessor_policies::list_item>::ptr
                     ((accessor<pybind11::detail::accessor_policies::list_item> *)local_88);
    ptVar4 = get_type_info(type);
    object::~object((object *)(local_88 + 0x18));
    bVar3 = pcVar6[0x80] & 0xfdU | ptVar4->field_0x80 & 2;
  }
  else {
    mark_parents_nonsimple(this,*(PyTypeObject **)pcVar6);
    bVar3 = pcVar6[0x80] & 0xfd;
  }
  pcVar6[0x80] = bVar3;
  return;
}

Assistant:

void initialize(const type_record &rec) {
        if (rec.scope && hasattr(rec.scope, rec.name))
            pybind11_fail("generic_type: cannot initialize type \"" + std::string(rec.name) +
                          "\": an object with that name is already defined");

        if (get_type_info(*rec.type))
            pybind11_fail("generic_type: type \"" + std::string(rec.name) +
                          "\" is already registered!");

        m_ptr = make_new_python_type(rec);

        /* Register supplemental type information in C++ dict */
        auto *tinfo = new detail::type_info();
        tinfo->type = (PyTypeObject *) m_ptr;
        tinfo->cpptype = rec.type;
        tinfo->type_size = rec.type_size;
        tinfo->operator_new = rec.operator_new;
        tinfo->holder_size_in_ptrs = size_in_ptrs(rec.holder_size);
        tinfo->init_holder = rec.init_holder;
        tinfo->dealloc = rec.dealloc;
        tinfo->simple_type = true;
        tinfo->simple_ancestors = true;

        auto &internals = get_internals();
        auto tindex = std::type_index(*rec.type);
        tinfo->direct_conversions = &internals.direct_conversions[tindex];
        tinfo->default_holder = rec.default_holder;
        internals.registered_types_cpp[tindex] = tinfo;
        internals.registered_types_py[(PyTypeObject *) m_ptr] = { tinfo };

        if (rec.bases.size() > 1 || rec.multiple_inheritance) {
            mark_parents_nonsimple(tinfo->type);
            tinfo->simple_ancestors = false;
        }
        else if (rec.bases.size() == 1) {
            auto parent_tinfo = get_type_info((PyTypeObject *) rec.bases[0].ptr());
            tinfo->simple_ancestors = parent_tinfo->simple_ancestors;
        }
    }